

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O2

int bcf_remove_filter(bcf_hdr_t *hdr,bcf1_t *line,int flt_id,int pass)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  
  if ((line->unpacked & 2) == 0) {
    hdr = (bcf_hdr_t *)line;
    bcf_unpack(line,2);
  }
  uVar2 = (line->d).n_flt;
  uVar5 = 0;
  uVar4 = 0;
  if (0 < (int)uVar2) {
    uVar4 = (ulong)uVar2;
  }
  do {
    if (uVar4 == uVar5) {
LAB_0011c22f:
      uVar3 = (uint)uVar4;
      if (uVar3 != uVar2) {
        piVar1 = &(line->d).shared_dirty;
        *(byte *)piVar1 = (byte)*piVar1 | 4;
        if (uVar3 != uVar2 - 1) {
          piVar1 = (line->d).flt;
          hdr = (bcf_hdr_t *)(piVar1 + uVar4);
          memmove(hdr,piVar1 + uVar4 + 1,(long)(int)(uVar2 + ~uVar3) << 2);
          uVar2 = (line->d).n_flt;
        }
        (line->d).n_flt = uVar2 - 1;
        if (pass != 0 && uVar2 - 1 == 0) {
          bcf_add_filter(hdr,line,0);
        }
      }
      return 0;
    }
    if ((line->d).flt[uVar5] == flt_id) {
      uVar4 = uVar5 & 0xffffffff;
      goto LAB_0011c22f;
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

int bcf_remove_filter(const bcf_hdr_t *hdr, bcf1_t *line, int flt_id, int pass)
{
    if ( !(line->unpacked & BCF_UN_FLT) ) bcf_unpack(line, BCF_UN_FLT);
    int i;
    for (i=0; i<line->d.n_flt; i++)
        if ( flt_id==line->d.flt[i] ) break;
    if ( i==line->d.n_flt ) return 0;   // the filter is not present
    line->d.shared_dirty |= BCF1_DIRTY_FLT;
    if ( i!=line->d.n_flt-1 ) memmove(line->d.flt+i,line->d.flt+i+1,(line->d.n_flt-i-1)*sizeof(*line->d.flt));
    line->d.n_flt--;
    if ( !line->d.n_flt && pass ) bcf_add_filter(hdr,line,0);
    return 0;
}